

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void free_cdef_row_sync(AV1CdefRowSync **cdef_row_mt,int num_mi_rows)

{
  int in_ESI;
  long *in_RDI;
  int row_idx;
  int iVar1;
  
  if (*in_RDI != 0) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      if (*(long *)(*in_RDI + (long)iVar1 * 0x18) != 0) {
        pthread_mutex_destroy(*(pthread_mutex_t **)(*in_RDI + (long)iVar1 * 0x18));
        aom_free((void *)CONCAT44(in_ESI,iVar1));
      }
      if (*(long *)(*in_RDI + (long)iVar1 * 0x18 + 8) != 0) {
        pthread_cond_destroy(*(pthread_cond_t **)(*in_RDI + (long)iVar1 * 0x18 + 8));
        aom_free((void *)CONCAT44(in_ESI,iVar1));
      }
    }
    aom_free((void *)CONCAT44(in_ESI,iVar1));
    *in_RDI = 0;
  }
  return;
}

Assistant:

static inline void free_cdef_row_sync(AV1CdefRowSync **cdef_row_mt,
                                      const int num_mi_rows) {
  if (*cdef_row_mt == NULL) return;
#if CONFIG_MULTITHREAD
  for (int row_idx = 0; row_idx < num_mi_rows; row_idx++) {
    if ((*cdef_row_mt)[row_idx].row_mutex_ != NULL) {
      pthread_mutex_destroy((*cdef_row_mt)[row_idx].row_mutex_);
      aom_free((*cdef_row_mt)[row_idx].row_mutex_);
    }
    if ((*cdef_row_mt)[row_idx].row_cond_ != NULL) {
      pthread_cond_destroy((*cdef_row_mt)[row_idx].row_cond_);
      aom_free((*cdef_row_mt)[row_idx].row_cond_);
    }
  }
#else
  (void)num_mi_rows;
#endif  // CONFIG_MULTITHREAD
  aom_free(*cdef_row_mt);
  *cdef_row_mt = NULL;
}